

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_ciphersuite_stream(ptls_cipher_suite_t *cs1,ptls_cipher_suite_t *cs2)

{
  char *pcVar1;
  int iVar2;
  ptls_aead_context_t *ppVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  size_t decoff;
  long lVar8;
  char dec [1024];
  char enc [1024];
  
  ppVar3 = ptls_aead_new(cs1->aead,cs1->hash,1,"012345678901234567890123456789012345678901234567",
                         (char *)0x0);
  if (ppVar3 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                  0x117,"void test_ciphersuite_stream(ptls_cipher_suite_t *, ptls_cipher_suite_t *)"
                 );
  }
  if (ppVar3->do_encrypt_init !=
      (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0) {
    (*ppVar3->do_encrypt_init)(ppVar3,0,(void *)0x0,0);
    lVar8 = 0;
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
      pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_1a0a0_00146490 + lVar7);
      sVar4 = strlen(pcVar1);
      sVar5 = (*ppVar3->do_encrypt_update)(ppVar3,enc + lVar8,pcVar1,sVar4);
      lVar8 = lVar8 + sVar5;
    }
    sVar5 = (*ppVar3->do_encrypt_final)(ppVar3,enc + lVar8);
    ptls_aead_free(ppVar3);
    ppVar3 = ptls_aead_new(cs2->aead,cs2->hash,0,"012345678901234567890123456789012345678901234567",
                           (char *)0x0);
    sVar6 = (*ppVar3->do_decrypt)(ppVar3,dec,enc,sVar5 + lVar8,0,(void *)0x0,0);
    _ok((uint)(sVar6 != 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x126);
    _ok((uint)(sVar6 == (sVar5 + lVar8) - cs1->aead->tag_size),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x127);
    ptls_aead_free(ppVar3);
    sVar5 = 0;
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
      pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_1a0a0_00146490 + lVar7);
      sVar4 = strlen(pcVar1);
      _ok((uint)(sVar4 + sVar5 <= sVar6),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x130);
      sVar4 = strlen(pcVar1);
      iVar2 = bcmp(dec + sVar5,pcVar1,sVar4);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x131);
      sVar4 = strlen(pcVar1);
      sVar5 = sVar5 + sVar4;
    }
    _ok((uint)(sVar5 == sVar6),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x12d);
    return;
  }
  note("new ciphers may omit support for init-update-final");
  return;
}

Assistant:

static void test_ciphersuite_stream(ptls_cipher_suite_t *cs1, ptls_cipher_suite_t *cs2)
{
    const char *traffic_secret = "012345678901234567890123456789012345678901234567",
               *text[] = {
                   "CHAPTER I.\n",
                   "Down the Rabbit-Hole\n",
                   "Alice was beginning to get very tired of sitting by her sister on the bank, and of having nothing to do: once "
                   "or twice she had peeped into the book her sister was reading, but it had no pictures or conversations in it, "
                   "“and what is the use of a book,” thought Alice “without pictures or conversations?”\n",
                   "So she was considering in her own mind (as well as she could, for the hot day made her feel very sleepy and "
                   "stupid), whether the pleasure of making a daisy-chain would be worth the trouble of getting up and picking the "
                   "daisies, when suddenly a White Rabbit with pink eyes ran close by her.\n",
                   NULL,
               };
    ptls_aead_context_t *c;
    char enc[1024], dec[1024];
    size_t enclen, declen;

    /* encrypt */
    c = ptls_aead_new(cs1->aead, cs1->hash, 1, traffic_secret, NULL);
    assert(c != NULL);
    if (c->do_encrypt_init == NULL) {
        note("new ciphers may omit support for init-update-final");
        return;
    }
    ptls_aead_encrypt_init(c, 0, NULL, 0);
    enclen = 0;
    for (size_t i = 0; text[i] != NULL; ++i)
        enclen += ptls_aead_encrypt_update(c, enc + enclen, text[i], strlen(text[i]));
    enclen += ptls_aead_encrypt_final(c, enc + enclen);
    ptls_aead_free(c);

    /* decrypt */
    c = ptls_aead_new(cs2->aead, cs2->hash, 0, traffic_secret, NULL);
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 0, NULL, 0);
    ok(declen != SIZE_MAX);
    ok(declen == enclen - cs1->aead->tag_size);
    ptls_aead_free(c);

    /* check text */
    for (size_t i = 0, decoff = 0;; ++i) {
        if (text[i] == NULL) {
            ok(decoff == declen);
            break;
        }
        ok(decoff + strlen(text[i]) <= declen);
        ok(memcmp(dec + decoff, text[i], strlen(text[i])) == 0);
        decoff += strlen(text[i]);
    }
}